

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O1

int testing::internal::AppropriateResolution<float>(float val)

{
  float fVar1;
  float fVar2;
  
  fVar2 = -val;
  if (-val <= val) {
    fVar2 = val;
  }
  fVar1 = 1e+06;
  if (1e+06 <= fVar2) {
    if (1e+10 <= fVar2) {
      return 9;
    }
    if (1e+09 <= fVar2) {
      fVar1 = 10000.0;
    }
    else if (1e+08 <= fVar2) {
      fVar1 = 1000.0;
    }
    else if (1e+07 <= fVar2) {
      fVar1 = 100.0;
    }
    else if (1e+06 <= fVar2) {
      fVar1 = 10.0;
    }
    else {
      fVar1 = 1.0;
    }
    fVar1 = (float)(int)(fVar2 / fVar1 + 0.5) * fVar1;
  }
  else {
    if (100000.0 <= fVar2) {
      fVar1 = 1.0;
    }
    else if (10000.0 <= fVar2) {
      fVar1 = 10.0;
    }
    else if (1000.0 <= fVar2) {
      fVar1 = 100.0;
    }
    else if (100.0 <= fVar2) {
      fVar1 = 1000.0;
    }
    else if (10.0 <= fVar2) {
      fVar1 = 10000.0;
    }
    else if (1.0 <= fVar2) {
      fVar1 = 100000.0;
    }
    else if (fVar2 < 0.1) {
      if (0.01 <= fVar2) {
        fVar1 = 1e+07;
      }
      else if (0.001 <= fVar2) {
        fVar1 = 1e+08;
      }
      else if (0.0001 <= fVar2) {
        fVar1 = 1e+09;
      }
      else {
        fVar1 = 1e+10;
      }
    }
    fVar1 = (float)(int)(fVar2 * fVar1 + 0.5) / fVar1;
  }
  if ((fVar1 == fVar2) && (!NAN(fVar1) && !NAN(fVar2))) {
    return 6;
  }
  return 9;
}

Assistant:

int AppropriateResolution(FloatType val) {
  int full = std::numeric_limits<FloatType>::max_digits10;
  if (val < 0) val = -val;

  if (val < 1000000) {
    FloatType mulfor6 = 1e10;
    if (val >= 100000.0) {  // 100,000 to 999,999
      mulfor6 = 1.0;
    } else if (val >= 10000.0) {
      mulfor6 = 1e1;
    } else if (val >= 1000.0) {
      mulfor6 = 1e2;
    } else if (val >= 100.0) {
      mulfor6 = 1e3;
    } else if (val >= 10.0) {
      mulfor6 = 1e4;
    } else if (val >= 1.0) {
      mulfor6 = 1e5;
    } else if (val >= 0.1) {
      mulfor6 = 1e6;
    } else if (val >= 0.01) {
      mulfor6 = 1e7;
    } else if (val >= 0.001) {
      mulfor6 = 1e8;
    } else if (val >= 0.0001) {
      mulfor6 = 1e9;
    }
    if (static_cast<FloatType>(static_cast<int32_t>(val * mulfor6 + 0.5)) /
            mulfor6 ==
        val)
      return 6;
  } else if (val < 1e10) {
    FloatType divfor6 = 1.0;
    if (val >= 1e9) {  // 1,000,000,000 to 9,999,999,999
      divfor6 = 10000;
    } else if (val >= 1e8) {  // 100,000,000 to 999,999,999
      divfor6 = 1000;
    } else if (val >= 1e7) {  // 10,000,000 to 99,999,999
      divfor6 = 100;
    } else if (val >= 1e6) {  // 1,000,000 to 9,999,999
      divfor6 = 10;
    }
    if (static_cast<FloatType>(static_cast<int32_t>(val / divfor6 + 0.5)) *
            divfor6 ==
        val)
      return 6;
  }
  return full;
}